

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CovarianceMatrix.cpp
# Opt level: O2

void __thiscall CovarianceMatrix::modelToQueries(CovarianceMatrix *this)

{
  QueryCompiler *pQVar1;
  bool bVar2;
  Function *pFVar3;
  Aggregate *this_00;
  Query *q;
  ulong uVar4;
  Query **__x;
  vector<Query_*,_std::allocator<Query_*>_> *this_01;
  size_t var;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong __position;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  Query *linear;
  vector<Query_*,_std::allocator<Query_*>_> *local_978;
  Aggregate *agg_quad;
  var_bitset *local_968;
  var_bitset *local_960;
  ulong local_958;
  ulong local_950;
  Query *quad;
  size_t local_940;
  ulong local_938;
  ulong local_930;
  Query *count;
  Aggregate *agg_count;
  Aggregate *agg_linear;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_858;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_828;
  prod_bitset prod_linear_v1;
  prod_bitset prod_quad_v1;
  size_t featureToFunction [100];
  size_t quadFeatureToFunction [100];
  
  local_960 = &(this->super_Application)._features;
  local_968 = &this->_categoricalFeatures;
  sVar6 = 0;
  for (sVar5 = 0; sVar5 != 100; sVar5 = sVar5 + 1) {
    bVar2 = std::bitset<100UL>::test(local_960,sVar5);
    if ((bVar2) && (bVar2 = std::bitset<100UL>::test(local_968,sVar5), !bVar2)) {
      pQVar1 = (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_978 = (vector<Query_*,_std::allocator<Query_*>_> *)sVar6;
      pFVar3 = (Function *)operator_new(0x48);
      __l._M_len = 1;
      __l._M_array = (iterator)&prod_linear_v1;
      prod_linear_v1.super__Base_bitset<24UL>._M_w[0] = sVar5;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &local_828,__l,(less<unsigned_long> *)&prod_quad_v1,(allocator_type *)&agg_linear);
      Function::Function(pFVar3,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                 *)&local_828,sum);
      QueryCompiler::addFunction(pQVar1,pFVar3);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_828);
      featureToFunction[sVar5] = (size_t)local_978;
      sVar6 = (long)local_978 + 1;
    }
  }
  for (sVar5 = 0; sVar5 != 100; sVar5 = sVar5 + 1) {
    bVar2 = std::bitset<100UL>::test(local_960,sVar5);
    if ((bVar2) && (bVar2 = std::bitset<100UL>::test(local_968,sVar5), !bVar2)) {
      pQVar1 = (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_978 = (vector<Query_*,_std::allocator<Query_*>_> *)sVar6;
      pFVar3 = (Function *)operator_new(0x48);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&prod_linear_v1;
      prod_linear_v1.super__Base_bitset<24UL>._M_w[0] = sVar5;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &local_858,__l_00,(less<unsigned_long> *)&prod_quad_v1,
                 (allocator_type *)&agg_linear);
      Function::Function(pFVar3,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                 *)&local_858,quadratic_sum);
      QueryCompiler::addFunction(pQVar1,pFVar3);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_858);
      quadFeatureToFunction[sVar5] = (size_t)local_978;
      sVar6 = (long)local_978 + 1;
    }
  }
  this_00 = (Aggregate *)operator_new(0x30);
  (this_00->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  agg_count = this_00;
  memset(&prod_linear_v1,0,0xc0);
  std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
  emplace_back<std::bitset<1500ul>>
            ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)this_00,
             &prod_linear_v1);
  q = (Query *)operator_new(0x30);
  (q->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (q->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  (q->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (q->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (q->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  count = q;
  std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back(&q->_aggregates,&agg_count);
  q->_rootID = ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->_root->_id;
  QueryCompiler::addQuery
            ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             q);
  local_978 = &this->listOfQueries;
  std::vector<Query_*,_std::allocator<Query_*>_>::push_back(local_978,&count);
  local_940 = ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_root->_id;
  local_958 = 1;
  for (__position = 0; __position != 100; __position = __position + 1) {
    uVar7 = __position >> 6;
    uVar4 = 1L << ((byte)__position & 0x3f);
    if (((local_960->super__Base_bitset<2UL>)._M_w[uVar7] >> (__position & 0x3f) & 1) != 0) {
      memset(&prod_linear_v1,0,0xc0);
      memset(&prod_quad_v1,0,0xc0);
      local_950 = __position;
      local_938 = uVar4;
      local_930 = uVar7;
      if (((local_968->super__Base_bitset<2UL>)._M_w[uVar7] & uVar4) == 0) {
        std::bitset<1500UL>::set(&prod_linear_v1,featureToFunction[__position],true);
        agg_linear = (Aggregate *)operator_new(0x30);
        (agg_linear->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (agg_linear->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (agg_linear->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (agg_linear->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (agg_linear->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (agg_linear->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                  ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)agg_linear,
                   &prod_linear_v1);
        linear = (Query *)operator_new(0x30);
        (linear->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (linear->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (linear->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (linear->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (linear->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
                  (&linear->_aggregates,&agg_linear);
        linear->_rootID = local_940;
        QueryCompiler::addQuery
                  ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,linear);
        this_01 = local_978;
        std::vector<Query_*,_std::allocator<Query_*>_>::push_back(local_978,&linear);
        std::bitset<1500UL>::set(&prod_quad_v1,quadFeatureToFunction[__position],true);
        agg_quad = (Aggregate *)operator_new(0x30);
        (agg_quad->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (agg_quad->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (agg_quad->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (agg_quad->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (agg_quad->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (agg_quad->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                  ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)agg_quad,
                   &prod_quad_v1);
        quad = (Query *)operator_new(0x30);
        (quad->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (quad->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (quad->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (quad->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (quad->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
                  (&quad->_aggregates,&agg_quad);
        quad->_rootID =
             ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_root->_id;
        QueryCompiler::addQuery
                  ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,quad);
        __x = &quad;
      }
      else {
        agg_linear = (Aggregate *)operator_new(0x30);
        (agg_linear->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (agg_linear->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (agg_linear->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (agg_linear->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (agg_linear->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (agg_linear->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                  ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)agg_linear,
                   &prod_linear_v1);
        linear = (Query *)operator_new(0x30);
        (linear->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (linear->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (linear->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (linear->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (linear->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
                  (&linear->_aggregates,&agg_linear);
        std::bitset<100UL>::set(&linear->_fVars,__position,true);
        linear->_rootID = this->_queryRootIndex[__position];
        QueryCompiler::addQuery
                  ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,linear);
        __x = &linear;
        this_01 = local_978;
      }
      std::vector<Query_*,_std::allocator<Query_*>_>::push_back(this_01,__x);
      for (uVar4 = local_958; __position = local_950, uVar4 - 1 < 99; uVar4 = uVar4 + 1) {
        if (((local_960->super__Base_bitset<2UL>)._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) {
          memcpy(&agg_linear,&prod_linear_v1,0xc0);
          linear = (Query *)operator_new(0x30);
          linear->_rootID = 0;
          (linear->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
          (linear->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
          (linear->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (linear->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (linear->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          agg_quad = (Aggregate *)operator_new(0x30);
          (agg_quad->_agg).
          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (agg_quad->_agg).
          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (agg_quad->_incoming).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (agg_quad->_incoming).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (agg_quad->_incoming).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (agg_quad->_agg).
          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        _root->_id;
          if (((this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[local_930] & local_938) !=
              0) {
            (agg_quad->_agg).
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)this->_queryRootIndex[local_950];
            std::bitset<100UL>::set
                      ((bitset<100UL> *)
                       &(agg_quad->_agg).
                        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,local_950,true);
          }
          if (((local_968->super__Base_bitset<2UL>)._M_w[uVar4 >> 6] & 1L << ((byte)uVar4 & 0x3f))
              == 0) {
            std::bitset<1500UL>::set((bitset<1500UL> *)&agg_linear,featureToFunction[uVar4],true);
          }
          else {
            std::bitset<100UL>::set
                      ((bitset<100UL> *)
                       &(agg_quad->_agg).
                        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,uVar4,true);
            (agg_quad->_agg).
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)this->_queryRootIndex[uVar4];
          }
          std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                    ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)linear,
                     (value_type *)&agg_linear);
          std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
                    ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)&agg_quad->_incoming,
                     (value_type *)&linear);
          QueryCompiler::addQuery
                    ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(Query *)agg_quad);
          std::vector<Query_*,_std::allocator<Query_*>_>::push_back
                    (local_978,(value_type *)&agg_quad);
        }
      }
    }
    local_958 = local_958 + 1;
  }
  return;
}

Assistant:

void CovarianceMatrix::modelToQueries()
{
    size_t numberOfFunctions = 0;
    size_t featureToFunction[NUM_OF_VARIABLES],
        quadFeatureToFunction[NUM_OF_VARIABLES];
    
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_features.test(var) && !_categoricalFeatures.test(var))
        {
            _compiler->addFunction(
                new Function({var}, Operation::sum));
            featureToFunction[var] = numberOfFunctions;
            numberOfFunctions++;
        }
    }

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_features.test(var) && !_categoricalFeatures.test(var))
        {
            _compiler->addFunction(
                new Function({var}, Operation::quadratic_sum));
            quadFeatureToFunction[var] = numberOfFunctions;
            numberOfFunctions++;
        }
    }

    Aggregate* agg_count = new Aggregate();
    agg_count->_agg.push_back(prod_bitset());
            
    Query* count = new Query();
    count->_aggregates.push_back(agg_count);
    count->_rootID = _td->_root->_id;
    _compiler->addQuery(count);
    listOfQueries.push_back(count);    
    
    size_t numberOfQueries = 0;
    size_t cont_var_root = _td->_root->_id;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features[var])
            continue;
        
        prod_bitset prod_linear_v1;
        prod_bitset prod_quad_v1;

        if (!_categoricalFeatures[var])
        {
            // Linear function per Feature 
            prod_linear_v1.set(featureToFunction[var]);
 
            Aggregate* agg_linear = new Aggregate();
            agg_linear->_agg.push_back(prod_linear_v1);
            
            Query* linear = new Query();
            linear->_aggregates.push_back(agg_linear);
            linear->_rootID = cont_var_root;

            _compiler->addQuery(linear);
            
            listOfQueries.push_back(linear);            
            ++numberOfQueries;            
            
            // Quadratic function for each feature
            prod_quad_v1.set(quadFeatureToFunction[var]);
            
            Aggregate* agg_quad = new Aggregate();
            agg_quad->_agg.push_back(prod_quad_v1);
            
            Query* quad = new Query();
            quad->_aggregates.push_back(agg_quad);
            quad->_rootID = _td->_root->_id; // cont_var_root;

            _compiler->addQuery(quad);
            
            listOfQueries.push_back(quad);
            ++numberOfQueries;
        }
        else
        {
            Aggregate* agg_linear = new Aggregate();
            agg_linear->_agg.push_back(prod_linear_v1);
            
            Query* linear = new Query();
            linear->_aggregates.push_back(agg_linear);
            linear->_fVars.set(var);
            linear->_rootID = _queryRootIndex[var];
            _compiler->addQuery(linear);

            listOfQueries.push_back(linear);
            ++numberOfQueries;
        }
        

        for (size_t var2 = var+1; var2 < NUM_OF_VARIABLES; ++var2)
        {
            if (_features[var2])
            {
                //*****************************************//
                prod_bitset prod_quad_v2 = prod_linear_v1;
                
                Aggregate* agg_quad_v2 = new Aggregate();
                
                Query* quad_v2 = new Query();
                quad_v2->_rootID = _td->_root->_id;

                // if (_categoricalFeatures[var])
                // {
                //     quad_v2->_rootID = _queryRootIndex[var];
                //     quad_v2->_fVars.set(var);
                //     if (_categoricalFeatures[var2])
                //     {
                //         quad_v2->_fVars.set(var2);
                //         // If both varaibles are categoricalVars - we choose the
                //         // var2 as the root
                //         // TODO: We should use the root that is highest to the
                //         // original root
                //         if (_queryRootIndex[var2] <= _queryRootIndex[var])
                //             quad_v2->_rootID = _queryRootIndex[var2];
                //     }
                //     else
                //     {
                //         prod_quad_v2.set(featureToFunction[var2]);
                //     }
                // }
                // else if (_categoricalFeatures[var2])
                // {
                //     quad_v2->_fVars.set(var2);
                //     quad_v2->_rootID = _queryRootIndex[var2];
                // }
                // else
                // {
                //     // create prod_quad_v2 of both var and var2
                //     prod_quad_v2.set(featureToFunction[var2]);                    
                // }
                if (_categoricalFeatures[var])
                {
                    quad_v2->_rootID = _queryRootIndex[var];
                    quad_v2->_fVars.set(var);                    
                }
                
                if (_categoricalFeatures[var2])
                {
                    quad_v2->_fVars.set(var2);
                    // If both varaibles are categoricalVars - we choose the
                    // var2 as the root
                    quad_v2->_rootID = _queryRootIndex[var2];
                }
                else
                {
                    // create prod_quad_v2 of both var and var2
                    prod_quad_v2.set(featureToFunction[var2]);                    
                }
                
                agg_quad_v2->_agg.push_back(prod_quad_v2);
                
                quad_v2->_aggregates.push_back(agg_quad_v2);
                _compiler->addQuery(quad_v2);
                
                // TODO: Here we add both sides! multiply var times param of
                // var2 -- add that to gradient of var. And then multiply var2
                // times param of var and add to gradient of var2! -- this can
                // be done togther in one pass over the vector!

                listOfQueries.push_back(quad_v2);                
                ++numberOfQueries;
                // TODO: once we have identified the queries and how they are
                // multiplied, we then need to identify the actual views that
                // are computed over and use the information group computation
                // over this view!
            }
        }
    }
}